

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void localfunc(LexState *ls)

{
  byte bVar1;
  int iVar2;
  FuncState *fs_00;
  TString *name;
  LocVar *pLVar3;
  int fvar;
  FuncState *fs;
  expdesc b;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  bVar1 = fs_00->nactvar;
  b._16_8_ = ls;
  name = str_checkname(ls);
  new_localvar(ls,name);
  adjustlocalvars((LexState *)b._16_8_,1);
  body((LexState *)b._16_8_,(expdesc *)&fs,0,*(int *)(b._16_8_ + 4));
  iVar2 = fs_00->pc;
  pLVar3 = localdebuginfo(fs_00,(uint)bVar1);
  pLVar3->startpc = iVar2;
  return;
}

Assistant:

static void localfunc (LexState *ls) {
  expdesc b;
  FuncState *fs = ls->fs;
  int fvar = fs->nactvar;  /* function's variable index */
  new_localvar(ls, str_checkname(ls));  /* new local variable */
  adjustlocalvars(ls, 1);  /* enter its scope */
  body(ls, &b, 0, ls->linenumber);  /* function created in next register */
  /* debug information will only see the variable after this point! */
  localdebuginfo(fs, fvar)->startpc = fs->pc;
}